

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc-type-utils.h
# Opt level: O0

optional<wasm::Field> *
wasm::GCTypeUtils::getField(optional<wasm::Field> *__return_storage_ptr__,HeapType type,Index index)

{
  HeapTypeKind HVar1;
  Struct *this;
  const_reference __t;
  Field local_28;
  Index local_14;
  HeapType HStack_10;
  Index index_local;
  HeapType type_local;
  
  local_14 = index;
  HStack_10.id = type.id;
  HVar1 = HeapType::getKind(&stack0xfffffffffffffff0);
  switch(HVar1) {
  case Basic:
  case Func:
  case Cont:
  default:
    std::optional<wasm::Field>::optional(__return_storage_ptr__);
    break;
  case Struct:
    this = HeapType::getStruct(&stack0xfffffffffffffff0);
    __t = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                    (&this->fields,(ulong)local_14);
    std::optional<wasm::Field>::optional<const_wasm::Field_&,_true>(__return_storage_ptr__,__t);
    break;
  case Array:
    HeapType::getArray((HeapType *)&local_28);
    std::optional<wasm::Field>::optional<wasm::Field,_true>(__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::optional<Field> getField(HeapType type, Index index = 0) {
  switch (type.getKind()) {
    case HeapTypeKind::Struct:
      return type.getStruct().fields[index];
    case HeapTypeKind::Array:
      return type.getArray().element;
    case HeapTypeKind::Func:
    case HeapTypeKind::Cont:
    case HeapTypeKind::Basic:
      break;
  }
  return {};
}